

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Partition * __thiscall ASDCP::MXF::Partition::InitFromFile(Partition *this,IFileReader *Reader)

{
  int iVar1;
  undefined1 local_21;
  IFileReader *Reader_local;
  Partition *this_local;
  Result_t *result;
  
  local_21 = 0;
  Reader_local = Reader;
  this_local = this;
  KLVFilePacket::InitFromFile(&this->super_KLVFilePacket,Reader);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    InitFromBuffer((Partition *)&stack0xffffffffffffff60,(byte_t *)Reader,
                   (ui32_t)*(undefined8 *)(Reader + 0x18));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff60);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff60);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::InitFromFile(const Kumu::IFileReader& Reader)
{
  Result_t result = KLVFilePacket::InitFromFile(Reader);
  // test the UL
  // could be one of several values
  if ( ASDCP_SUCCESS(result) )
    result = ASDCP::MXF::Partition::InitFromBuffer(m_ValueStart, m_ValueLength);
  
  return result;
}